

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,long Val)

{
  long Val_local;
  long tmp;
  
  Val_local = Val;
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    tmp = Val;
    StreamSwapBytes<long>(&tmp);
    (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&tmp,8);
  }
  (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&Val_local,8);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(long Val) {
    if (big_endian_machine) {
        long tmp = Val;
        StreamSwapBytes<long>(&tmp);
        this->Output((char*)&tmp, sizeof(long));
    }
    this->Output((char*)&Val, sizeof(long));
    return (*this);
}